

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

uint32_t rebuild_hflags_a32(CPUARMState_conflict *env,int fp_el,ARMMMUIdx mmu_idx)

{
  ulong uVar1;
  ARMMMUIdx mmu_idx_00;
  uint uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  mmu_idx_00 = rebuild_hflags_aprofile(env);
  uVar5 = env->features;
  uVar1 = uVar5 & 0x10000000;
  uVar2 = (uint)uVar5 & 0x10000000;
  uVar7 = 0;
  if ((uVar5 & 0x200000000) == 0) {
    uVar7 = (ulong)(uVar2 >> 0x1c);
  }
  if ((~uVar5 & 0x210000000) == 0) {
    uVar7 = (ulong)((uint)(env->cp15).scr_el3 >> 10);
  }
  if (((uVar5 >> 0x20 & 1) == 0) ||
     (((uVar5 & 0x200000000) != 0 && (((env->cp15).scr_el3 & 1) == 0)))) {
LAB_0061892e:
    if ((uVar7 & 1) != 0) {
      mmu_idx_00 = mmu_idx_00 | 0x4000;
    }
  }
  else if ((uVar7 & 1) != 0) {
    uVar7 = (env->cp15).hcr_el2 >> 0x1f;
    goto LAB_0061892e;
  }
  if (((uint)uVar5 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar6 = env->uncached_cpsr & 0x1f;
      if (uVar6 != 0x10) {
        if ((uVar6 == 0x16) || (uVar6 == 0x1a)) goto LAB_006189bf;
        if ((uVar5 & 0x200000000) != 0) {
          if (uVar6 != 0x16) {
            uVar5 = (ulong)((uint)(env->cp15).scr_el3 & 1 | uVar2);
            uVar1 = uVar5;
          }
          if (uVar1 == 0) goto LAB_006189bf;
        }
      }
    }
    else if ((env->pstate & 8) != 0) goto LAB_006189bf;
  }
  if ((env->cp15).hstr_el2 != 0) {
    uVar4 = arm_hcr_el2_eff_aarch64(env);
    uVar5 = (ulong)(mmu_idx_00 | 0x10000);
    if ((~uVar4 & 0x408000000) != 0) {
      mmu_idx_00 = mmu_idx_00 | 0x10000;
    }
  }
LAB_006189bf:
  uVar3 = rebuild_hflags_common_32(env,fp_el,mmu_idx_00,(uint32_t)uVar5);
  return uVar3;
}

Assistant:

static uint32_t rebuild_hflags_a32(CPUARMState *env, int fp_el,
                                   ARMMMUIdx mmu_idx)
{
    uint32_t flags = rebuild_hflags_aprofile(env);

    if (arm_el_is_aa64(env, 1)) {
        FIELD_DP32(flags, TBFLAG_A32, VFPEN, 1, flags);
    }

    if (arm_current_el(env) < 2 && env->cp15.hstr_el2 &&
        (arm_hcr_el2_eff(env) & (HCR_E2H | HCR_TGE)) != (HCR_E2H | HCR_TGE)) {
        FIELD_DP32(flags, TBFLAG_A32, HSTR_ACTIVE, 1, flags);
    }

    return rebuild_hflags_common_32(env, fp_el, mmu_idx, flags);
}